

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

void __thiscall
CFG::Block::Block(Block *this,Relooper *relooper,Expression *CodeInit,
                 Expression *SwitchConditionInit)

{
  list<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  *plVar1;
  list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *plVar2;
  
  this->relooper = relooper;
  (this->BranchesOut).Map._M_h._M_buckets = &(this->BranchesOut).Map._M_h._M_single_bucket;
  (this->BranchesOut).Map._M_h._M_bucket_count = 1;
  (this->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->BranchesOut).Map._M_h._M_element_count = 0;
  (this->BranchesOut).Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->BranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->BranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  plVar1 = &(this->BranchesOut).List;
  (this->BranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->BranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->BranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->BranchesIn).Map._M_h._M_buckets = &(this->BranchesIn).Map._M_h._M_single_bucket;
  (this->BranchesIn).Map._M_h._M_bucket_count = 1;
  (this->BranchesIn).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->BranchesIn).Map._M_h._M_element_count = 0;
  (this->BranchesIn).Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->BranchesIn).Map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->BranchesIn).Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  plVar2 = &(this->BranchesIn).List;
  (this->BranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->BranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->BranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->ProcessedBranchesOut).Map._M_h._M_buckets =
       &(this->ProcessedBranchesOut).Map._M_h._M_single_bucket;
  (this->ProcessedBranchesOut).Map._M_h._M_bucket_count = 1;
  (this->ProcessedBranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ProcessedBranchesOut).Map._M_h._M_element_count = 0;
  (this->ProcessedBranchesOut).Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ProcessedBranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ProcessedBranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  plVar1 = &(this->ProcessedBranchesOut).List;
  (this->ProcessedBranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->ProcessedBranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->ProcessedBranchesOut).List.
  super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->ProcessedBranchesIn).Map._M_h._M_buckets =
       &(this->ProcessedBranchesIn).Map._M_h._M_single_bucket;
  (this->ProcessedBranchesIn).Map._M_h._M_bucket_count = 1;
  (this->ProcessedBranchesIn).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ProcessedBranchesIn).Map._M_h._M_element_count = 0;
  (this->ProcessedBranchesIn).Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ProcessedBranchesIn).Map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ProcessedBranchesIn).Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  plVar2 = &(this->ProcessedBranchesIn).List;
  (this->ProcessedBranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->ProcessedBranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->ProcessedBranchesIn).List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
  _M_impl._M_node._M_size = 0;
  this->Parent = (Shape *)0x0;
  this->Id = -1;
  this->Code = CodeInit;
  this->SwitchCondition = SwitchConditionInit;
  this->IsCheckedMultipleEntry = false;
  return;
}

Assistant:

Block::Block(Relooper* relooper,
             wasm::Expression* CodeInit,
             wasm::Expression* SwitchConditionInit)
  : relooper(relooper), Code(CodeInit), SwitchCondition(SwitchConditionInit),
    IsCheckedMultipleEntry(false) {}